

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriConnectivity.cc
# Opt level: O2

HalfedgeHandle __thiscall
OpenMesh::TriConnectivity::insert_loop(TriConnectivity *this,HalfedgeHandle _hh)

{
  VertexHandle _end_vh;
  VertexHandle _start_vh;
  BaseHandle _heh;
  FaceHandle _fh;
  FaceHandle _fh_00;
  HalfedgeHandle HVar1;
  Halfedge *pHVar2;
  Face *pFVar3;
  HalfedgeHandle _nheh;
  
  _end_vh = ArrayKernel::to_vertex_handle
                      ((ArrayKernel *)this,
                       (HalfedgeHandle)
                       ((-((uint)_hh.super_BaseHandle.idx_ & 1) | 1) +
                       (int)_hh.super_BaseHandle.idx_));
  _start_vh = ArrayKernel::to_vertex_handle((ArrayKernel *)this,_hh);
  _heh.idx_ = (int)ArrayKernel::new_edge((ArrayKernel *)this,_start_vh,_end_vh);
  _nheh.super_BaseHandle.idx_ = (BaseHandle)((-(_heh.idx_ & 1U) | 1) + _heh.idx_);
  _fh = ArrayKernel::face_handle((ArrayKernel *)this,_hh);
  _fh_00 = ArrayKernel::new_face((ArrayKernel *)this);
  HVar1 = ArrayKernel::prev_halfedge_handle((ArrayKernel *)this,_hh.super_BaseHandle.idx_);
  ArrayKernel::set_next_halfedge_handle((ArrayKernel *)this,HVar1,_nheh);
  HVar1 = ArrayKernel::next_halfedge_handle((ArrayKernel *)this,_hh);
  ArrayKernel::set_next_halfedge_handle((ArrayKernel *)this,_nheh,HVar1);
  ArrayKernel::set_next_halfedge_handle((ArrayKernel *)this,(HalfedgeHandle)_heh.idx_,_hh);
  ArrayKernel::set_next_halfedge_handle((ArrayKernel *)this,_hh,(HalfedgeHandle)_heh.idx_);
  pHVar2 = ArrayKernel::halfedge((ArrayKernel *)this,_nheh);
  (pHVar2->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ =
       (int)_fh.super_BaseHandle.idx_;
  pHVar2 = ArrayKernel::halfedge((ArrayKernel *)this,_hh);
  (pHVar2->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ =
       (int)_fh_00.super_BaseHandle.idx_;
  pHVar2 = ArrayKernel::halfedge((ArrayKernel *)this,(HalfedgeHandle)_heh.idx_);
  (pHVar2->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ =
       (int)_fh_00.super_BaseHandle.idx_;
  pFVar3 = ArrayKernel::face((ArrayKernel *)this,_fh_00);
  (pFVar3->halfedge_handle_).super_BaseHandle.idx_ = (int)_hh.super_BaseHandle.idx_;
  if (_fh.super_BaseHandle.idx_ != -1) {
    pFVar3 = ArrayKernel::face((ArrayKernel *)this,_fh);
    (pFVar3->halfedge_handle_).super_BaseHandle.idx_ = (int)_nheh.super_BaseHandle.idx_;
  }
  PolyConnectivity::adjust_outgoing_halfedge(&this->super_PolyConnectivity,_end_vh);
  PolyConnectivity::adjust_outgoing_halfedge(&this->super_PolyConnectivity,_start_vh);
  return (BaseHandle)(BaseHandle)_heh.idx_;
}

Assistant:

TriConnectivity::HalfedgeHandle
TriConnectivity::insert_loop(HalfedgeHandle _hh)
{
  HalfedgeHandle  h0(_hh);
  HalfedgeHandle  o0(opposite_halfedge_handle(h0));

  VertexHandle    v0(to_vertex_handle(o0));
  VertexHandle    v1(to_vertex_handle(h0));

  HalfedgeHandle  h1 = new_edge(v1, v0);
  HalfedgeHandle  o1 = opposite_halfedge_handle(h1);

  FaceHandle      f0 = face_handle(h0);
  FaceHandle      f1 = new_face();

  // halfedge -> halfedge
  set_next_halfedge_handle(prev_halfedge_handle(h0), o1);
  set_next_halfedge_handle(o1, next_halfedge_handle(h0));
  set_next_halfedge_handle(h1, h0);
  set_next_halfedge_handle(h0, h1);

  // halfedge -> face
  set_face_handle(o1, f0);
  set_face_handle(h0, f1);
  set_face_handle(h1, f1);

  // face -> halfedge
  set_halfedge_handle(f1, h0);
  if (f0.is_valid())
    set_halfedge_handle(f0, o1);


  // vertex -> halfedge
  adjust_outgoing_halfedge(v0);
  adjust_outgoing_halfedge(v1);

  return h1;
}